

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsl_types.cpp
# Opt level: O1

uint __thiscall glsl_type::std140_base_alignment(glsl_type *this,bool row_major)

{
  glsl_base_type gVar1;
  uint uVar2;
  uint uVar3;
  glsl_type *pgVar4;
  byte bVar5;
  glsl_base_type type;
  ulong uVar6;
  long lVar7;
  
  do {
    while( true ) {
      gVar1 = *(glsl_base_type *)&this->field_0x4;
      type = gVar1 & 0xff;
      uVar2 = glsl_base_type_bit_size(type);
      bVar5 = this->vector_elements;
      uVar3 = (uint)bVar5;
      if (((gVar1 & 0xfe) < GLSL_TYPE_ATOMIC_UINT && bVar5 == 1) ||
         ((((gVar1 & 0xfc) < GLSL_TYPE_SAMPLER && (1 < bVar5)) && (this->matrix_columns == '\x01')))
         ) {
        uVar2 = (uint)(uVar2 == 0x40) * 4 + 4;
        if (bVar5 - 3 < 2) {
          return uVar2 * 4;
        }
        if (bVar5 == 1) {
          return uVar2;
        }
        if (uVar3 == 2) {
          return uVar2 * 2;
        }
      }
      if (type != GLSL_TYPE_ARRAY) break;
      pgVar4 = (this->fields).array;
      uVar3 = *(uint *)&pgVar4->field_0x4;
      if (pgVar4->vector_elements == 1 && (uVar3 & 0xfe) < 0xe) {
LAB_00188d7d:
        uVar3 = std140_base_alignment(pgVar4,(bool)(row_major & 1));
        if (uVar3 < 0x11) goto LAB_00188e88;
        this = (this->fields).array;
      }
      else {
        uVar2 = uVar3 & 0xff;
        if (((pgVar4->matrix_columns == 1 && 1 < pgVar4->vector_elements) && (uVar3 & 0xfc) < 0xc)
           || (uVar2 - 2 < 3 && 1 < pgVar4->matrix_columns)) goto LAB_00188d7d;
        this = pgVar4;
        if ((uVar2 != 0xf) && (uVar2 != 0x11)) {
          __assert_fail("this->fields.array->is_struct() || this->fields.array->is_array()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl_types.cpp"
                        ,0x6ce,"unsigned int glsl_type::std140_base_alignment(bool) const");
        }
      }
    }
    bVar5 = this->matrix_columns;
    if ((bVar5 < 2) || (2 < type - GLSL_TYPE_FLOAT)) {
      if (type != GLSL_TYPE_STRUCT) {
        __assert_fail("!\"not reached\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl_types.cpp"
                      ,0x70b,"unsigned int glsl_type::std140_base_alignment(bool) const");
      }
      if (this->length == 0) {
LAB_00188e88:
        uVar3 = 0x10;
      }
      else {
        uVar3 = 0x10;
        lVar7 = 0x20;
        uVar6 = 0;
        do {
          uVar2 = *(uint *)((long)&((this->fields).array)->gl_type + lVar7) >> 5 & 3;
          if (uVar2 == 2) {
            bVar5 = 1;
          }
          else {
            bVar5 = row_major;
            if (uVar2 == 1) {
              bVar5 = 0;
            }
          }
          pgVar4 = *(glsl_type **)((long)(this->fields).array + lVar7 + -0x20);
          uVar2 = std140_base_alignment(pgVar4,(bool)(bVar5 & 1));
          if (uVar3 <= uVar2) {
            uVar3 = std140_base_alignment(pgVar4,(bool)(bVar5 & 1));
          }
          uVar6 = uVar6 + 1;
          lVar7 = lVar7 + 0x30;
        } while (uVar6 < this->length);
      }
      return uVar3;
    }
    uVar2 = (uint)bVar5;
    if ((row_major & 1U) != 0) {
      uVar2 = uVar3;
      uVar3 = (uint)bVar5;
    }
    row_major = false;
    pgVar4 = get_instance(type,uVar3,1,0,false);
    this = get_array_instance(pgVar4,uVar2,0);
  } while( true );
}

Assistant:

unsigned
glsl_type::std140_base_alignment(bool row_major) const
{
   unsigned N = is_64bit() ? 8 : 4;

   /* (1) If the member is a scalar consuming <N> basic machine units, the
    *     base alignment is <N>.
    *
    * (2) If the member is a two- or four-component vector with components
    *     consuming <N> basic machine units, the base alignment is 2<N> or
    *     4<N>, respectively.
    *
    * (3) If the member is a three-component vector with components consuming
    *     <N> basic machine units, the base alignment is 4<N>.
    */
   if (this->is_scalar() || this->is_vector()) {
      switch (this->vector_elements) {
      case 1:
         return N;
      case 2:
         return 2 * N;
      case 3:
      case 4:
         return 4 * N;
      }
   }

   /* (4) If the member is an array of scalars or vectors, the base alignment
    *     and array stride are set to match the base alignment of a single
    *     array element, according to rules (1), (2), and (3), and rounded up
    *     to the base alignment of a vec4. The array may have padding at the
    *     end; the base offset of the member following the array is rounded up
    *     to the next multiple of the base alignment.
    *
    * (6) If the member is an array of <S> column-major matrices with <C>
    *     columns and <R> rows, the matrix is stored identically to a row of
    *     <S>*<C> column vectors with <R> components each, according to rule
    *     (4).
    *
    * (8) If the member is an array of <S> row-major matrices with <C> columns
    *     and <R> rows, the matrix is stored identically to a row of <S>*<R>
    *     row vectors with <C> components each, according to rule (4).
    *
    * (10) If the member is an array of <S> structures, the <S> elements of
    *      the array are laid out in order, according to rule (9).
    */
   if (this->is_array()) {
      if (this->fields.array->is_scalar() ||
          this->fields.array->is_vector() ||
          this->fields.array->is_matrix()) {
         return MAX2(this->fields.array->std140_base_alignment(row_major), 16);
      } else {
         assert(this->fields.array->is_struct() ||
                this->fields.array->is_array());
         return this->fields.array->std140_base_alignment(row_major);
      }
   }

   /* (5) If the member is a column-major matrix with <C> columns and
    *     <R> rows, the matrix is stored identically to an array of
    *     <C> column vectors with <R> components each, according to
    *     rule (4).
    *
    * (7) If the member is a row-major matrix with <C> columns and <R>
    *     rows, the matrix is stored identically to an array of <R>
    *     row vectors with <C> components each, according to rule (4).
    */
   if (this->is_matrix()) {
      const struct glsl_type *vec_type, *array_type;
      int c = this->matrix_columns;
      int r = this->vector_elements;

      if (row_major) {
         vec_type = get_instance(base_type, c, 1);
         array_type = glsl_type::get_array_instance(vec_type, r);
      } else {
         vec_type = get_instance(base_type, r, 1);
         array_type = glsl_type::get_array_instance(vec_type, c);
      }

      return array_type->std140_base_alignment(false);
   }

   /* (9) If the member is a structure, the base alignment of the
    *     structure is <N>, where <N> is the largest base alignment
    *     value of any of its members, and rounded up to the base
    *     alignment of a vec4. The individual members of this
    *     sub-structure are then assigned offsets by applying this set
    *     of rules recursively, where the base offset of the first
    *     member of the sub-structure is equal to the aligned offset
    *     of the structure. The structure may have padding at the end;
    *     the base offset of the member following the sub-structure is
    *     rounded up to the next multiple of the base alignment of the
    *     structure.
    */
   if (this->is_struct()) {
      unsigned base_alignment = 16;
      for (unsigned i = 0; i < this->length; i++) {
         bool field_row_major = row_major;
         const enum glsl_matrix_layout matrix_layout =
            glsl_matrix_layout(this->fields.structure[i].matrix_layout);
         if (matrix_layout == GLSL_MATRIX_LAYOUT_ROW_MAJOR) {
            field_row_major = true;
         } else if (matrix_layout == GLSL_MATRIX_LAYOUT_COLUMN_MAJOR) {
            field_row_major = false;
         }

         const struct glsl_type *field_type = this->fields.structure[i].type;
         base_alignment = MAX2(base_alignment,
                               field_type->std140_base_alignment(field_row_major));
      }
      return base_alignment;
   }

   assert(!"not reached");
   return -1;
}